

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O0

int32_t __thiscall webrtc::TraceImpl::AddLevel(TraceImpl *this,char *sz_message,TraceLevel level)

{
  int kMessageLength;
  TraceLevel level_local;
  char *sz_message_local;
  TraceImpl *this_local;
  
  if (level == kTraceStateInfo) {
    sprintf(sz_message,"STATEINFO ; ");
  }
  else if (level == kTraceWarning) {
    sprintf(sz_message,"WARNING   ; ");
  }
  else if (level == kTraceError) {
    sprintf(sz_message,"ERROR     ; ");
  }
  else if (level == kTraceCritical) {
    sprintf(sz_message,"CRITICAL  ; ");
  }
  else if (level == kTraceApiCall) {
    sprintf(sz_message,"APICALL   ; ");
  }
  else if (level == kTraceModuleCall) {
    sprintf(sz_message,"MODULECALL; ");
  }
  else if (level == kTraceMemory) {
    sprintf(sz_message,"MEMORY    ; ");
  }
  else if (level == kTraceTimer) {
    sprintf(sz_message,"TIMER     ; ");
  }
  else if (level == kTraceStream) {
    sprintf(sz_message,"STREAM    ; ");
  }
  else if (level == kTraceDebug) {
    sprintf(sz_message,"DEBUG     ; ");
  }
  else if (level == kTraceInfo) {
    sprintf(sz_message,"DEBUGINFO ; ");
  }
  else {
    if (level != kTraceTerseInfo) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/system_wrappers/source/trace_impl.cc"
                    ,0x7f,"int32_t webrtc::TraceImpl::AddLevel(char *, const TraceLevel) const");
    }
    memset(sz_message,0x20,0xc);
    sz_message[0xc] = '\0';
  }
  return 0xc;
}

Assistant:

int32_t TraceImpl::AddLevel(char* sz_message, const TraceLevel level) const {
  const int kMessageLength = 12;
  switch (level) {
    case kTraceTerseInfo:
      // Add the appropriate amount of whitespace.
      memset(sz_message, ' ', kMessageLength);
      sz_message[kMessageLength] = '\0';
      break;
    case kTraceStateInfo:
      sprintf(sz_message, "STATEINFO ; ");
      break;
    case kTraceWarning:
      sprintf(sz_message, "WARNING   ; ");
      break;
    case kTraceError:
      sprintf(sz_message, "ERROR     ; ");
      break;
    case kTraceCritical:
      sprintf(sz_message, "CRITICAL  ; ");
      break;
    case kTraceInfo:
      sprintf(sz_message, "DEBUGINFO ; ");
      break;
    case kTraceModuleCall:
      sprintf(sz_message, "MODULECALL; ");
      break;
    case kTraceMemory:
      sprintf(sz_message, "MEMORY    ; ");
      break;
    case kTraceTimer:
      sprintf(sz_message, "TIMER     ; ");
      break;
    case kTraceStream:
      sprintf(sz_message, "STREAM    ; ");
      break;
    case kTraceApiCall:
      sprintf(sz_message, "APICALL   ; ");
      break;
    case kTraceDebug:
      sprintf(sz_message, "DEBUG     ; ");
      break;
    default:
      assert(false);
      return 0;
  }
  // All messages are 12 characters.
  return kMessageLength;
}